

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# carver.cpp
# Opt level: O0

Carver * __thiscall carver::Carver::carveImage(Carver *this)

{
  out_of_range *this_00;
  Mat *in_RSI;
  Carver *in_RDI;
  undefined1 *in_R8;
  vector<int,_std::allocator<int>_> horizontalSeam_1;
  vector<int,_std::allocator<int>_> verticalSeam_1;
  future<std::vector<int,_std::allocator<int>_>_> horizontalSeamFuture;
  future<std::vector<int,_std::allocator<int>_>_> verticalSeamFuture;
  vector<int,_std::allocator<int>_> horizontalSeam;
  vector<int,_std::allocator<int>_> verticalSeam;
  Mat energyMap;
  Mat grayscale;
  int h;
  int v;
  Mat *target;
  Mat *in_stack_fffffffffffff9e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9f8;
  vector<int,_std::allocator<int>_> *__x;
  undefined7 in_stack_fffffffffffffa00;
  undefined1 uVar1;
  undefined4 in_stack_fffffffffffffa18;
  undefined4 in_stack_fffffffffffffa1c;
  int in_stack_fffffffffffffa20;
  int in_stack_fffffffffffffa24;
  Carver *this_01;
  int __val;
  Mat *in_stack_fffffffffffffa40;
  Carver *in_stack_fffffffffffffa48;
  type *in_stack_fffffffffffffa60;
  launch in_stack_fffffffffffffa6c;
  Mat local_580 [144];
  Mat local_4f0 [16];
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffb20;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffb28;
  Mat *in_stack_fffffffffffffb30;
  Carver *in_stack_fffffffffffffb38;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffb58;
  Mat *in_stack_fffffffffffffb60;
  Carver *in_stack_fffffffffffffb68;
  undefined1 local_478 [16];
  int in_stack_fffffffffffffb98;
  int in_stack_fffffffffffffb9c;
  Carver *in_stack_fffffffffffffba0;
  Mat local_448 [36];
  CarveMode in_stack_fffffffffffffbdc;
  Mat *in_stack_fffffffffffffbe0;
  Carver *in_stack_fffffffffffffbe8;
  undefined8 in_stack_fffffffffffffc30;
  Carver *in_stack_fffffffffffffc38;
  Mat local_348 [96];
  _InputArray local_2e8;
  _InputArray local_2d0;
  undefined1 local_2b1;
  Mat local_2b0 [96];
  Mat local_250 [96];
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [39];
  undefined1 local_129;
  string local_38 [32];
  int local_18;
  int local_14;
  
  local_14 = 0;
  local_18 = 0;
  if (*(int *)(in_RSI + 0x7c) == 0) {
    if ((*(int *)(in_RSI + 0x60) == 2) || (*(int *)(in_RSI + 0x60) == 0)) {
      in_stack_fffffffffffffa24 = (int)((float)*(int *)(in_RSI + 0x70) * *(float *)(in_RSI + 0x68));
    }
    else {
      in_stack_fffffffffffffa24 = 0;
    }
    *(int *)(in_RSI + 0x74) = in_stack_fffffffffffffa24;
    if ((*(int *)(in_RSI + 0x60) == 2) || (*(int *)(in_RSI + 0x60) == 1)) {
      in_stack_fffffffffffffa20 = (int)((float)*(int *)(in_RSI + 0x6c) * *(float *)(in_RSI + 0x68));
    }
    else {
      in_stack_fffffffffffffa20 = 0;
    }
    *(int *)(in_RSI + 0x78) = in_stack_fffffffffffffa20;
  }
  else {
    if ((*(int *)(in_RSI + 0x60) == 2) || (*(int *)(in_RSI + 0x60) == 0)) {
      in_stack_fffffffffffffa1c = *(undefined4 *)(in_RSI + 0x7c);
    }
    else {
      in_stack_fffffffffffffa1c = 0;
    }
    *(undefined4 *)(in_RSI + 0x74) = in_stack_fffffffffffffa1c;
    if ((*(int *)(in_RSI + 0x60) == 2) || (*(int *)(in_RSI + 0x60) == 1)) {
      in_stack_fffffffffffffa18 = *(undefined4 *)(in_RSI + 0x7c);
    }
    else {
      in_stack_fffffffffffffa18 = 0;
    }
    *(undefined4 *)(in_RSI + 0x78) = in_stack_fffffffffffffa18;
    if ((*(int *)(in_RSI + 0x6c) <= *(int *)(in_RSI + 0x78)) ||
       (*(int *)(in_RSI + 0x70) <= *(int *)(in_RSI + 0x74))) {
      local_129 = 1;
      this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
      __val = (int)((ulong)in_RSI >> 0x20);
      std::__cxx11::to_string(__val);
      std::operator+((char *)in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0);
      std::operator+(in_stack_fffffffffffff9f8,(char *)in_stack_fffffffffffff9f0);
      std::__cxx11::to_string(__val);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
      std::operator+(in_stack_fffffffffffff9f8,(char *)in_stack_fffffffffffff9f0);
      std::__cxx11::to_string(__val);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
      std::out_of_range::out_of_range(this_00,local_38);
      local_129 = 0;
      __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
  }
  this_01 = in_RDI;
  std::__cxx11::to_string((int)((ulong)in_RSI >> 0x20));
  std::operator+((char *)in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0);
  std::operator+(in_stack_fffffffffffff9f8,(char *)in_stack_fffffffffffff9f0);
  std::__cxx11::to_string((int)((ulong)in_RSI >> 0x20));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
  std::operator+(in_stack_fffffffffffff9f8,(char *)in_stack_fffffffffffff9f0);
  log_(this_01,(string *)in_RDI);
  std::__cxx11::string::~string(local_150);
  std::__cxx11::string::~string(local_170);
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::string::~string(local_190);
  std::__cxx11::string::~string(local_1b0);
  std::__cxx11::string::~string(local_1d0);
  cv::Mat::Mat(local_250);
  cv::Mat::Mat(local_2b0);
  local_2b1 = 0;
  cv::Mat::Mat(&in_RDI->originalImage_,in_RSI);
  while( true ) {
    uVar1 = true;
    if (*(int *)(in_RSI + 0x74) <= local_14) {
      uVar1 = local_18 < *(int *)(in_RSI + 0x78);
    }
    if ((bool)uVar1 == false) break;
    cv::_InputArray::_InputArray((_InputArray *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8)
    ;
    cv::_OutputArray::_OutputArray
              ((_OutputArray *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
    cv::cvtColor((cv *)&local_2d0,&local_2e8,(_OutputArray *)0x6,0,(int)in_R8);
    cv::_OutputArray::~_OutputArray((_OutputArray *)0x115b21);
    cv::_InputArray::~_InputArray(&local_2d0);
    calculateEnergy(in_stack_fffffffffffffc38,(Mat *)in_stack_fffffffffffffc30);
    cv::Mat::operator=(local_2b0,local_348);
    cv::Mat::~Mat(local_348);
    if ((local_14 < *(int *)(in_RSI + 0x74)) && (local_18 < *(int *)(in_RSI + 0x78))) {
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x115ba5);
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x115bb2);
      std::async<carver::Carver::carveImage()::__0>
                (in_stack_fffffffffffffa6c,in_stack_fffffffffffffa60);
      std::async<carver::Carver::carveImage()::__1>
                (in_stack_fffffffffffffa6c,(type *)in_stack_fffffffffffffa60);
      std::future<std::vector<int,_std::allocator<int>_>_>::get
                ((future<std::vector<int,_std::allocator<int>_>_> *)
                 CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18));
      __x = (vector<int,_std::allocator<int>_> *)&stack0xfffffffffffffc30;
      std::vector<int,_std::allocator<int>_>::operator=
                ((vector<int,_std::allocator<int>_> *)CONCAT17(uVar1,in_stack_fffffffffffffa00),__x)
      ;
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)CONCAT17(uVar1,in_stack_fffffffffffffa00));
      std::future<std::vector<int,_std::allocator<int>_>_>::get
                ((future<std::vector<int,_std::allocator<int>_>_> *)
                 CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18));
      in_stack_fffffffffffff9f0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &stack0xfffffffffffffc18;
      std::vector<int,_std::allocator<int>_>::operator=
                ((vector<int,_std::allocator<int>_> *)CONCAT17(uVar1,in_stack_fffffffffffffa00),__x)
      ;
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)CONCAT17(uVar1,in_stack_fffffffffffffa00));
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa40,
                 (vector<int,_std::allocator<int>_> *)in_RSI);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa40,
                 (vector<int,_std::allocator<int>_> *)in_RSI);
      in_R8 = local_478;
      removeSeams(in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
                  in_stack_fffffffffffffb20);
      cv::Mat::operator=(&in_RDI->originalImage_,local_448);
      cv::Mat::~Mat(local_448);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)CONCAT17(uVar1,in_stack_fffffffffffffa00));
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)CONCAT17(uVar1,in_stack_fffffffffffffa00));
      local_14 = local_14 + 1;
      local_18 = local_18 + 1;
      std::future<std::vector<int,_std::allocator<int>_>_>::~future
                ((future<std::vector<int,_std::allocator<int>_>_> *)0x115d5b);
      std::future<std::vector<int,_std::allocator<int>_>_>::~future
                ((future<std::vector<int,_std::allocator<int>_>_> *)0x115d68);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)CONCAT17(uVar1,in_stack_fffffffffffffa00));
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)CONCAT17(uVar1,in_stack_fffffffffffffa00));
    }
    else if (local_14 < *(int *)(in_RSI + 0x74)) {
      getSeamToRemove(in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc)
      ;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa40,
                 (vector<int,_std::allocator<int>_> *)in_RSI);
      removeVerticalSeam(in_stack_fffffffffffffa48,in_stack_fffffffffffffa40,
                         (vector<int,_std::allocator<int>_> *)in_RSI);
      cv::Mat::operator=(&in_RDI->originalImage_,local_4f0);
      cv::Mat::~Mat(local_4f0);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)CONCAT17(uVar1,in_stack_fffffffffffffa00));
      local_14 = local_14 + 1;
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)CONCAT17(uVar1,in_stack_fffffffffffffa00));
    }
    else if (local_18 < *(int *)(in_RSI + 0x78)) {
      getSeamToRemove(in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,in_stack_fffffffffffffbdc)
      ;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa40,
                 (vector<int,_std::allocator<int>_> *)in_RSI);
      removeHorizontalSeam
                (in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
      cv::Mat::operator=(&in_RDI->originalImage_,local_580);
      cv::Mat::~Mat(local_580);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)CONCAT17(uVar1,in_stack_fffffffffffffa00));
      local_18 = local_18 + 1;
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)CONCAT17(uVar1,in_stack_fffffffffffffa00));
    }
    printStatus_(in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
             (char *)in_RDI,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
  log_(this_01,(string *)in_RDI);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffa48);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffa47);
  local_2b1 = 1;
  cv::Mat::~Mat(local_2b0);
  cv::Mat::~Mat(local_250);
  return this_01;
}

Assistant:

cv::Mat Carver::carveImage() {
    // Set the iteration counters and max values
    int v = 0;
    int h = 0;

    if (!carveCount_) {
        vIterations_ = carveMode_ == BOTH || carveMode_ == VERTICAL ?
                    static_cast<int>(imageCols_ * carveAmount_) : 0;
        hIterations_ = carveMode_ == BOTH || carveMode_ == HORIZONTAL ?
                    static_cast<int>(imageRows_ * carveAmount_): 0;
    } else {
        vIterations_ = carveMode_ == BOTH || carveMode_ == VERTICAL ?
                    carveCount_ : 0;
        hIterations_ = carveMode_ == BOTH || carveMode_ == HORIZONTAL ?
                    carveCount_ : 0;

        if (!(hIterations_ < imageRows_) || !(vIterations_ < imageCols_))
            throw (out_of_range("Number of pixels to carve " +
                                to_string(carveCount_) +
                                " out of range for image of size " +
                                to_string(imageCols_) + "x" +
                                to_string(imageRows_)));
    }


    log_("Removing " + to_string(vIterations_) + " columns and " +
        to_string(hIterations_) + " rows");

    cv::Mat grayscale;
    cv::Mat energyMap;
    cv::Mat target = originalImage_;

    while(v < vIterations_ || h < hIterations_) {
        cv::cvtColor(target, grayscale, cv::COLOR_BGR2GRAY);
        energyMap = calculateEnergy(grayscale);
        if (v < vIterations_ && h < hIterations_) {
            vector<int> verticalSeam;
            vector<int> horizontalSeam;

            #ifdef CONCURRENT
            // Invoke asynchronous processing for seam pathfinding
            auto verticalSeamFuture =
                    async(launch::async, [this, &energyMap] {
                        return getSeamToRemove(energyMap, VERTICAL);
                    });
            auto horizontalSeamFuture =
                    async(launch::async, [this, &energyMap] {
                        return getSeamToRemove(energyMap, HORIZONTAL);
                    });

            // Synchronize
            verticalSeam = verticalSeamFuture.get();
            horizontalSeam = horizontalSeamFuture.get();

            #else
            verticalSeam = getSeamToRemove(energyMap, VERTICAL);
            horizontalSeam = getSeamToRemove(energyMap, HORIZONTAL);
            #endif

            target = removeSeams(target, verticalSeam, horizontalSeam);
            v++;
            h++;
        } else if (v < vIterations_) {
            vector<int> verticalSeam =
                    getSeamToRemove(energyMap, VERTICAL);
            target = removeVerticalSeam(target, verticalSeam);
            v++;
        } else if (h < hIterations_) {
            vector<int> horizontalSeam =
                    getSeamToRemove(energyMap, HORIZONTAL);
            target = removeHorizontalSeam(target, horizontalSeam);
            h++;
        }
        printStatus_(h, v);
    }
    log_("");
    return target;
}